

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

int cat(int argc,char **argv)

{
  char *__s1;
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  pointer ppVar6;
  undefined1 uVar7;
  int iVar8;
  Allocator alloc;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  Point2i p;
  Point2i p_00;
  uint uVar12;
  pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *v_1;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  long *plVar16;
  Tuple2<pbrt::Point2,_int> p_01;
  __normal_iterator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_*,_std::vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>_>
  __i;
  pointer ppVar17;
  Tuple2<pbrt::Point2,_int> TVar18;
  memory_resource *pmVar19;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar20;
  int iVar21;
  uint uVar22;
  undefined8 uVar23;
  long lVar24;
  long *plVar25;
  bool bVar26;
  int va;
  int iStack_2ec;
  undefined1 local_2e8 [32];
  ulong local_2c8;
  size_t local_2c0;
  vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
  sorted;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_288;
  polymorphic_allocator<float> local_280;
  ImageChannelValues v;
  ImageAndMetadata im;
  
  if (argc == 0) {
    usage("cat","no filenames provided to \"cat\"?");
  }
  bVar26 = 0 < argc;
  if (0 < argc) {
    uVar14 = 0;
    bVar3 = false;
    bVar5 = false;
    bVar4 = false;
    do {
      __s1 = argv[uVar14];
      iVar8 = strcmp(__s1,"--sort");
      if ((iVar8 == 0) || (iVar8 = strcmp(__s1,"-sort"), iVar8 == 0)) {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else {
        iVar8 = strcmp(__s1,"--csv");
        if ((iVar8 == 0) || (iVar8 = strcmp(__s1,"-csv"), iVar8 == 0)) {
          bVar5 = (bool)(bVar5 ^ 1);
        }
        else {
          iVar8 = strcmp(__s1,"--list");
          if ((iVar8 == 0) || (iVar8 = strcmp(__s1,"-list"), iVar8 == 0)) {
            bVar4 = (bool)(bVar4 ^ 1);
          }
          else {
            if (bVar3) {
              if (bVar5) {
                cat();
                return (uint)bVar26;
              }
              if (bVar4) {
                cat();
                return (uint)bVar26;
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&va,__s1,(allocator<char> *)&v);
            alloc.memoryResource = pstd::pmr::new_delete_resource();
            local_288.bits = 0;
            pbrt::Image::Read(&im,(string *)&va,alloc,(ColorEncodingHandle *)&local_288);
            if (_va != local_2e8 + 8) {
              operator_delete(_va,local_2e8._8_8_ + 1);
            }
            uVar11 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
            uVar13 = 0;
            if (0 < (int)uVar11) {
              uVar13 = (ulong)im.image.resolution.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
            }
            uVar10 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
            uVar9 = 0;
            if (uVar10 != 0 && -1 < (long)im.image.resolution.super_Tuple2<pbrt::Point2,_int>) {
              uVar9 = (ulong)uVar10;
            }
            uVar15 = im.metadata.pixelBounds.optionalValue._8_8_;
            uVar23 = im.metadata.pixelBounds.optionalValue._0_8_;
            if (im.metadata.pixelBounds.set == false) {
              uVar15 = uVar13 | uVar9 << 0x20;
              uVar23 = (long *)CONCAT44((int)uVar10 >> 0x1f & uVar10,(int)uVar11 >> 0x1f & uVar11);
            }
            iVar8 = (int)uVar23;
            uVar10 = (uint)uVar15;
            uVar22 = (uint)((ulong)uVar23 >> 0x20);
            uVar11 = (uint)((ulong)uVar15 >> 0x20);
            if (bVar3) {
              sorted.
              super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              sorted.
              super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              sorted.
              super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar13 = (ulong)uVar23 >> 0x20;
              std::
              vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ::reserve(&sorted,(long)(int)((uVar11 - uVar22) * (uVar10 - iVar8)));
              if ((int)uVar11 <= (int)uVar22) {
                uVar11 = uVar22;
              }
              if ((int)uVar10 <= iVar8) {
                uVar11 = uVar22;
              }
              if (uVar11 != uVar22) {
                plVar16 = (long *)(uVar23 & 0xffffffff);
                plVar25 = (long *)uVar23;
                do {
                  p.super_Tuple2<pbrt::Point2,_int>.x = (int)plVar16 - iVar8;
                  p.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar13 - uVar22;
                  pbrt::Image::GetChannels
                            ((ImageChannelValues *)
                             &v.
                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             ,&im.image,p,(WrapMode2D)0x200000002);
                  _va = (pointer)plVar25;
                  local_280.memoryResource = pstd::pmr::new_delete_resource();
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )local_2e8,
                                &v.
                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                ,&local_280);
                  std::
                  vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>
                  ::emplace_back<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>
                            ((vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>
                              *)&sorted,(pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *)&va);
                  local_2c0 = 0;
                  (*(*(_func_int ***)local_2e8._0_8_)[3])
                            (local_2e8._0_8_,local_2e8._8_8_,local_2c8 << 2,4);
                  v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored
                       = 0;
                  (**(code **)(*(long *)CONCAT44(v.
                                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 .alloc.memoryResource._4_4_,
                                                 v.
                                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 .alloc.memoryResource._0_4_) + 0x18))
                            ((long *)CONCAT44(v.
                                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                              .alloc.memoryResource._4_4_,
                                              v.
                                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                              .alloc.memoryResource._0_4_),
                             v.
                             super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             .ptr,v.
                                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  .nAlloc << 2,4);
                  uVar12 = (int)plVar16 + 1;
                  plVar16 = (long *)(((ulong)plVar25 & 0xffffffff00000000) + 0x100000000 |
                                    uVar23 & 0xffffffff);
                  if (uVar12 != uVar10) {
                    plVar16 = (long *)((ulong)plVar25 & 0xffffffff00000000 | (ulong)uVar12);
                  }
                  uVar13 = (ulong)plVar16 >> 0x20;
                  plVar25 = plVar16;
                } while ((iVar8 != (int)plVar16) || (uVar11 != (uint)((ulong)plVar16 >> 0x20)));
              }
              ppVar6 = sorted.
                       super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              ppVar1 = sorted.
                       super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar2 = sorted.
                       super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (sorted.
                  super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  sorted.
                  super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                lVar24 = (long)sorted.
                               super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)sorted.
                               super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cat(int,char**)::__0>>
                          (sorted.
                           super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           sorted.
                           super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (int)LZCOUNT((lVar24 >> 3) * 0x6db6db6db6db6db7) * 2 ^ 0x7e);
                if (lVar24 < 0x381) {
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cat(int,char**)::__0>>
                            (ppVar1,ppVar6);
                  ppVar1 = sorted.
                           super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar2 = sorted.
                           super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  ppVar17 = ppVar1 + 0x10;
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cat(int,char**)::__0>>
                            (ppVar1,ppVar17);
                  for (; ppVar1 = sorted.
                                  super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                      ppVar2 = sorted.
                               super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish, ppVar17 != ppVar6;
                      ppVar17 = ppVar17 + 1) {
                    std::
                    __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,__gnu_cxx::__ops::_Val_comp_iter<cat(int,char**)::__0>>
                              (ppVar17);
                  }
                }
              }
              for (; ppVar6 = sorted.
                              super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                  ppVar1 != sorted.
                            super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; ppVar1 = ppVar1 + 1) {
                sorted.
                super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
                if (!bVar5) {
                  printf("(%d, %d): ",(ulong)(uint)(ppVar1->first).super_Tuple2<pbrt::Point2,_int>.x
                         ,(ulong)(uint)(ppVar1->first).super_Tuple2<pbrt::Point2,_int>.y);
                }
                uVar13 = (ppVar1->second).
                         super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                         nStored;
                if (uVar13 != 0) {
                  lVar24 = 0;
                  uVar9 = 0;
                  do {
                    paVar20 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                               *)(ppVar1->second).
                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                 .ptr;
                    if (paVar20 ==
                        (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                         *)0x0) {
                      paVar20 = &(ppVar1->second).
                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                 .field_2;
                    }
                    uVar7 = 0x2c;
                    if (uVar9 == uVar13 - 1) {
                      uVar7 = 10;
                    }
                    va._0_1_ = uVar7;
                    pbrt::Printf<float_const&,char>
                              ("%f%c",(float *)((long)paVar20 + lVar24),(char *)&va);
                    uVar9 = uVar9 + 1;
                    uVar13 = (ppVar1->second).
                             super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             .nStored;
                    lVar24 = lVar24 + 4;
                  } while (uVar9 < uVar13);
                }
                ppVar2 = sorted.
                         super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                sorted.
                super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
              }
              sorted.
              super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
              std::
              vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ::~vector(&sorted);
            }
            else if (bVar4) {
              va = (int)im.image.channelNames.nStored;
              v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
              memoryResource._0_4_ = 1;
              if ((int)im.image.channelNames.nStored != 1) {
                pbrt::
                LogFatal<char_const(&)[18],char_const(&)[2],char_const(&)[18],int&,char_const(&)[2],int&>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                           ,0x1fe,"Check failed: %s == %s with %s = %s, %s = %s",
                           (char (*) [18])"image.NChannels()",(char (*) [2])0x2d277c0,
                           (char (*) [18])"image.NChannels()",&va,(char (*) [2])0x2d277c0,(int *)&v)
                ;
              }
              uVar13 = (ulong)uVar23 >> 0x20;
              if ((int)uVar22 < (int)uVar11) {
                TVar18.x = 0;
                TVar18.y = 0;
                do {
                  p_01 = TVar18;
                  iVar21 = uVar10 - iVar8;
                  if (iVar8 < (int)uVar10) {
                    do {
                      pbrt::Image::GetChannel(&im.image,(Point2i)p_01,0,(WrapMode2D)0x200000002);
                      printf("%f ");
                      p_01 = (Tuple2<pbrt::Point2,_int>)((long)p_01 + 1);
                      iVar21 = iVar21 + -1;
                    } while (iVar21 != 0);
                  }
                  putchar(10);
                  uVar22 = (int)uVar13 + 1;
                  uVar13 = (ulong)uVar22;
                  TVar18 = (Tuple2<pbrt::Point2,_int>)((long)TVar18 + 0x100000000);
                } while (uVar22 != uVar11);
              }
            }
            else {
              uVar9 = (ulong)uVar23 >> 0x20;
              uVar13 = (ulong)uVar15 >> 0x20;
              if ((int)uVar11 <= (int)uVar22) {
                uVar13 = uVar9;
              }
              uVar11 = (uint)uVar13;
              if ((int)uVar10 <= iVar8) {
                uVar11 = uVar22;
              }
              if (uVar11 != uVar22) {
                plVar16 = (long *)(uVar23 & 0xffffffff);
                plVar25 = (long *)uVar23;
                do {
                  p_00.super_Tuple2<pbrt::Point2,_int>.x = (int)plVar16 - iVar8;
                  p_00.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar9 - uVar22;
                  pbrt::Image::GetChannels
                            ((ImageChannelValues *)&va,&im.image,p_00,(WrapMode2D)0x200000002);
                  if (!bVar5) {
                    printf("(%d, %d): ",(ulong)plVar16 & 0xffffffff,uVar9);
                  }
                  if (local_2c8 != 0) {
                    lVar24 = 0;
                    uVar13 = 0;
                    do {
                      pmVar19 = (memory_resource *)local_2e8._0_8_;
                      if ((memory_resource *)local_2e8._0_8_ == (memory_resource *)0x0) {
                        pmVar19 = (memory_resource *)(local_2e8 + 8);
                      }
                      uVar7 = 0x2c;
                      if (uVar13 == local_2c8 - 1) {
                        uVar7 = 10;
                      }
                      v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      alloc.memoryResource._0_1_ = uVar7;
                      pbrt::Printf<float&,char>
                                ("%f%c",(float *)((long)&pmVar19->_vptr_memory_resource + lVar24),
                                 (char *)&v);
                      uVar13 = uVar13 + 1;
                      lVar24 = lVar24 + 4;
                    } while (uVar13 < local_2c8);
                  }
                  local_2c8 = 0;
                  (**(code **)(*(long *)_va + 0x18))(_va,local_2e8._0_8_,local_2e8._24_8_ << 2,4);
                  uVar12 = (int)plVar16 + 1;
                  plVar16 = (long *)(((ulong)plVar25 & 0xffffffff00000000) + 0x100000000 |
                                    uVar23 & 0xffffffff);
                  if (uVar12 != uVar10) {
                    plVar16 = (long *)((ulong)plVar25 & 0xffffffff00000000 | (ulong)uVar12);
                  }
                  uVar9 = (ulong)plVar16 >> 0x20;
                  plVar25 = plVar16;
                } while ((iVar8 != (int)plVar16) || (uVar11 != (uint)((ulong)plVar16 >> 0x20)));
              }
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&im.metadata.stringVectors._M_t);
            if (im.metadata.colorSpace.set == true) {
              im.metadata.colorSpace.set = false;
            }
            if (im.metadata.MSE.set == true) {
              im.metadata.MSE.set = false;
            }
            if (im.metadata.samplesPerPixel.set == true) {
              im.metadata.samplesPerPixel.set = false;
            }
            if (im.metadata.fullResolution.set == true) {
              im.metadata.fullResolution.set = false;
            }
            if (im.metadata.pixelBounds.set == true) {
              im.metadata.pixelBounds.set = false;
            }
            if (im.metadata.NDCFromWorld.set == true) {
              im.metadata.NDCFromWorld.set = false;
            }
            if (im.metadata.cameraFromWorld.set == true) {
              im.metadata.cameraFromWorld.set = false;
            }
            if (im.metadata.renderTimeSeconds.set == true) {
              im.metadata.renderTimeSeconds.set = false;
            }
            im.image.p32.nStored = 0;
            (*(im.image.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                      (im.image.p32.alloc.memoryResource,im.image.p32.ptr,im.image.p32.nAlloc << 2,4
                      );
            im.image.p16.nStored = 0;
            (*(im.image.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                      (im.image.p16.alloc.memoryResource,im.image.p16.ptr,im.image.p16.nAlloc * 2,2)
            ;
            im.image.p8.nStored = 0;
            (*(im.image.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                      (im.image.p8.alloc.memoryResource,im.image.p8.ptr,im.image.p8.nAlloc,1);
            pbrt::
            InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~InlinedVector(&im.image.channelNames);
          }
        }
      }
      uVar14 = uVar14 + 1;
      bVar26 = uVar14 < (uint)argc;
    } while (uVar14 != (uint)argc);
  }
  return (uint)bVar26;
}

Assistant:

int cat(int argc, char *argv[]) {
    if (argc == 0)
        usage("cat", "no filenames provided to \"cat\"?");
    bool sort = false;
    bool csv = false;
    bool list = false;

    for (int i = 0; i < argc; ++i) {
        if (strcmp(argv[i], "--sort") == 0 || strcmp(argv[i], "-sort") == 0) {
            sort = !sort;
            continue;
        }
        if (strcmp(argv[i], "--csv") == 0 || strcmp(argv[i], "-csv") == 0) {
            csv = !csv;
            continue;
        }
        if (strcmp(argv[i], "--list") == 0 || strcmp(argv[i], "-list") == 0) {
            list = !list;
            continue;
        }

        if (sort && csv) {
            fprintf(stderr, "imgtool: --sort and --csv don't make sense to use "
                            "together.\n");
            return 1;
        }
        if (sort && list) {
            fprintf(stderr, "imgtool: --sort and --list don't make sense to "
                            "use together.\n");
            return 1;
        }

        ImageAndMetadata im = Image::Read(argv[i]);
        ImageMetadata &metadata = im.metadata;
        Image &image = im.image;

        Bounds2i pixelBounds =
            metadata.pixelBounds.value_or(Bounds2i({0, 0}, image.Resolution()));
        if (sort) {
            std::vector<std::pair<Point2i, ImageChannelValues>> sorted;
            sorted.reserve(pixelBounds.Area());
            for (Point2i p : pixelBounds) {
                ImageChannelValues v = image.GetChannels(
                    {p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y});
                sorted.push_back(std::make_pair(p, v));
            }

            std::sort(sorted.begin(), sorted.end(),
                      [](const std::pair<Point2i, ImageChannelValues> &a,
                         const std::pair<Point2i, ImageChannelValues> &b) {
                          return a.second.Average() < b.second.Average();
                      });
            for (const auto &v : sorted) {
                const ImageChannelValues &values = v.second;
                if (!csv)
                    printf("(%d, %d): ", v.first.x, v.first.y);
                for (size_t i = 0; i < values.size(); ++i)
                    Printf("%f%c", values[i], (i == values.size() - 1) ? '\n' : ',');
            }
        } else {
            if (list) {
                CHECK_EQ(image.NChannels(), 1);
                for (int y = pixelBounds.pMin.y; y < pixelBounds.pMax.y; ++y) {
                    for (int x = pixelBounds.pMin.x; x < pixelBounds.pMax.x; ++x)
                        printf("%f ",
                               image.GetChannel(
                                   {x - pixelBounds.pMin.x, y - pixelBounds.pMin.y}, 0));
                    printf("\n");
                }
            } else {
                for (Point2i p : pixelBounds) {
                    ImageChannelValues values = image.GetChannels(
                        {p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y});
                    if (!csv)
                        printf("(%d, %d): ", p.x, p.y);
                    for (size_t i = 0; i < values.size(); ++i)
                        Printf("%f%c", values[i], (i == values.size() - 1) ? '\n' : ',');
                }
            }
        }
    }
    return 0;
}